

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate_code.cpp
# Opt level: O2

void __thiscall
FrameMIPS::FrameMIPS(FrameMIPS *this,Label *label,Temp *returnValue,AccessList *localData)

{
  (this->super_Frame)._vptr_Frame = (_func_int **)&PTR_addParam_001243d0;
  this->label = label;
  this->returnValue = returnValue;
  this->localData = localData;
  this->frameSize = 0;
  this->regSize = 4;
  this->paramSize = 0;
  return;
}

Assistant:

FrameMIPS::FrameMIPS(Label *label, Temp *returnValue, AccessList *localData) {
    this->label = label;
    this->returnValue = returnValue;
    this->localData = localData;
    frameSize = 0;
    paramSize = 0;
    regSize = 4;
}